

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_extension.cpp
# Opt level: O3

void duckdb::GetEnvFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  reference vector;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  idx_t iVar12;
  idx_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong uVar14;
  long lVar15;
  data_ptr_t pdVar16;
  idx_t count;
  void *in_R8;
  idx_t idx_in_entry;
  ulong uVar17;
  idx_t iVar18;
  ulong uVar19;
  ulong uVar20;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t sVar21;
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  undefined1 local_c0 [24];
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  reference local_90;
  ulong local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  local_c0._0_8_ = result;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    pdVar4 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      if (count != 0) {
        lVar15 = 8;
        do {
          sVar21.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + lVar15);
          sVar21.value._0_8_ = *(undefined8 *)(pdVar4 + lVar15 + -8);
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (sVar21,(ValidityMask *)local_c0,in_RCX,in_R8);
          *(long *)(pdVar16 + lVar15 + -8) = sVar21.value._0_8_;
          *(long *)(pdVar16 + lVar15) = sVar21.value._8_8_;
          lVar15 = lVar15 + 0x10;
          count = count - 1;
        } while (count != 0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        local_c0._16_8_ = count + 0x3f >> 6;
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar17 = 0;
        local_90 = vector;
        do {
          puVar3 = (local_90->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_c0._8_8_ = p_Var13;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar9 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar9 = count;
            }
LAB_0022793f:
            uVar14 = uVar17;
            if (uVar17 < uVar9) {
              uVar19 = uVar17 << 4 | 8;
              do {
                input.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar19);
                input.value._0_8_ = *(undefined8 *)(pdVar4 + (uVar19 - 8));
                sVar21 = UnaryLambdaWrapper::
                         Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                                   (input,(ValidityMask *)local_c0,(idx_t)p_Var13,in_R8);
                *(long *)(pdVar16 + (uVar19 - 8)) = sVar21.value._0_8_;
                *(long *)(pdVar16 + uVar19) = sVar21.value._8_8_;
                uVar17 = uVar17 + 1;
                uVar19 = uVar19 + 0x10;
                uVar14 = uVar9;
              } while (uVar9 != uVar17);
            }
          }
          else {
            uVar19 = puVar3[(long)p_Var13];
            uVar9 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar9 = count;
            }
            uVar14 = uVar9;
            if (uVar19 != 0) {
              if (uVar19 == 0xffffffffffffffff) goto LAB_0022793f;
              local_88 = uVar9 - uVar17;
              uVar14 = uVar17;
              if (uVar17 <= uVar9 && local_88 != 0) {
                uVar20 = uVar17 << 4 | 8;
                uVar17 = 0;
                do {
                  if ((uVar19 >> (uVar17 & 0x3f) & 1) != 0) {
                    input_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar4 + uVar20);
                    input_00.value._0_8_ = *(undefined8 *)(pdVar4 + (uVar20 - 8));
                    sVar21 = UnaryLambdaWrapper::
                             Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                                       (input_00,(ValidityMask *)local_c0,(idx_t)p_Var13,in_R8);
                    *(long *)(pdVar16 + (uVar20 - 8)) = sVar21.value._0_8_;
                    *(long *)(pdVar16 + uVar20) = sVar21.value._8_8_;
                  }
                  uVar17 = uVar17 + 1;
                  uVar20 = uVar20 + 0x10;
                  uVar14 = uVar9;
                } while (local_88 != uVar17);
              }
            }
          }
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(((unsafe_unique_array<unsigned_long> *)
                             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->
                              _vptr__Sp_counted_base)->
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            )._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false> + 1);
          uVar17 = uVar14;
        } while (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._16_8_);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    paVar2 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                       ((string_t)paVar2->pointer,(ValidityMask *)local_c0,in_RCX,in_R8);
    paVar1->pointer = aVar22;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_78.sel)->sel_vector;
        pdVar16 = pdVar16 + 8;
        iVar18 = 0;
        do {
          iVar12 = iVar18;
          if (psVar5 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar5[iVar18];
          }
          input_02.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + iVar12 * 0x10 + 8);
          input_02.value._0_8_ = *(undefined8 *)(local_78.data + iVar12 * 0x10);
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (input_02,(ValidityMask *)local_c0,in_RCX,in_R8);
          *(long *)(pdVar16 + -8) = sVar21.value._0_8_;
          *(long *)pdVar16 = sVar21.value._8_8_;
          iVar18 = iVar18 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != iVar18);
      }
    }
    else if (count != 0) {
      psVar5 = (local_78.sel)->sel_vector;
      pdVar16 = pdVar16 + 8;
      uVar17 = 0;
      do {
        uVar9 = uVar17;
        if (psVar5 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar5[uVar17];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6]
             >> (uVar9 & 0x3f) & 1) == 0) {
          _Var11._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var8 = p_Stack_a0;
            peVar7 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar7;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var11._M_head_impl;
          }
          bVar6 = (byte)uVar17 & 0x3f;
          _Var11._M_head_impl[uVar17 >> 6] =
               _Var11._M_head_impl[uVar17 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          input_01.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + uVar9 * 0x10 + 8);
          input_01.value._0_8_ = *(undefined8 *)(local_78.data + uVar9 * 0x10);
          sVar21 = UnaryLambdaWrapper::
                   Operation<duckdb::GetEnvFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t>
                             (input_01,(ValidityMask *)local_c0,
                              local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_mask[uVar9 >> 6],in_R8);
          *(long *)(pdVar16 + -8) = sVar21.value._0_8_;
          *(long *)pdVar16 = sVar21.value._8_8_;
        }
        uVar17 = uVar17 + 1;
        pdVar16 = pdVar16 + 0x10;
      } while (count != uVar17);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void GetEnvFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string env_name = input.GetString();
		auto env_value = getenv(env_name.c_str());
		if (!env_value) {
			return StringVector::AddString(result, string());
		}
		return StringVector::AddString(result, env_value);
	});
}